

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::rayleigh_dist<float>::cdf(rayleigh_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  double dVar3;
  undefined4 local_4;
  
  if (0.0 < in_XMM0_Da) {
    rVar1 = param_type::nu(in_RDI);
    rVar2 = param_type::nu(in_RDI);
    dVar3 = std::exp((double)(ulong)(uint)((-in_XMM0_Da * in_XMM0_Da) / (rVar1 * 2.0 * rVar2)));
    local_4 = 1.0 - SUB84(dVar3,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return 1 - math::exp(-x * x / (2 * P.nu() * P.nu()));
    }